

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSAtom JS_ValueToAtom(JSContext *ctx,JSValue val)

{
  JSValue val_00;
  int iVar1;
  int in_EDX;
  JSAtomStruct *in_RSI;
  long in_RDI;
  JSValue JVar2;
  JSValue str;
  JSAtomStruct *p;
  uint32_t tag;
  JSAtom atom;
  JSValueUnion in_stack_ffffffffffffffa8;
  int64_t in_stack_ffffffffffffffb0;
  JSValueUnion ctx_00;
  int iVar3;
  JSAtom in_stack_ffffffffffffffbc;
  undefined4 uVar4;
  JSContext *in_stack_ffffffffffffffc0;
  JSValueUnion JVar5;
  JSAtom local_24;
  uint local_18;
  
  if ((in_EDX == 0) && (local_18 = (uint)in_RSI, local_18 < 0x80000000)) {
    local_24 = __JS_AtomFromUInt32(local_18);
  }
  else if (in_EDX == -8) {
    js_get_atom_index(*(JSRuntime **)(in_RDI + 0x18),in_RSI);
    local_24 = JS_DupAtom(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  else {
    JVar2.tag = in_stack_ffffffffffffffb0;
    JVar2.u.float64 = in_stack_ffffffffffffffa8.float64;
    JVar2 = JS_ToPropertyKey((JSContext *)0x12a764,JVar2);
    ctx_00 = JVar2.u;
    uVar4 = JVar2.tag._4_4_;
    iVar3 = (int)JVar2.tag;
    JVar5 = ctx_00;
    iVar1 = JS_IsException(JVar2);
    if (iVar1 != 0) {
      return 0;
    }
    if ((int)JVar2.tag == -8) {
      val_00.u._4_4_ = uVar4;
      val_00.u.int32 = iVar3;
      val_00.tag = (int64_t)JVar5.ptr;
      local_24 = js_symbol_to_atom((JSContext *)ctx_00.ptr,val_00);
    }
    else {
      local_24 = JS_NewAtomStr((JSContext *)CONCAT44(uVar4,iVar3),(JSString *)ctx_00.ptr);
    }
  }
  return local_24;
}

Assistant:

JSAtom JS_ValueToAtom(JSContext *ctx, JSValueConst val)
{
    JSAtom atom;
    uint32_t tag;
    tag = JS_VALUE_GET_TAG(val);
    if (tag == JS_TAG_INT &&
        (uint32_t)JS_VALUE_GET_INT(val) <= JS_ATOM_MAX_INT) {
        /* fast path for integer values */
        atom = __JS_AtomFromUInt32(JS_VALUE_GET_INT(val));
    } else if (tag == JS_TAG_SYMBOL) {
        JSAtomStruct *p = JS_VALUE_GET_PTR(val);
        atom = JS_DupAtom(ctx, js_get_atom_index(ctx->rt, p));
    } else {
        JSValue str;
        str = JS_ToPropertyKey(ctx, val);
        if (JS_IsException(str))
            return JS_ATOM_NULL;
        if (JS_VALUE_GET_TAG(str) == JS_TAG_SYMBOL) {
            atom = js_symbol_to_atom(ctx, str);
        } else {
            atom = JS_NewAtomStr(ctx, JS_VALUE_GET_STRING(str));
        }
    }
    return atom;
}